

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::Compiler::type_struct_member_array_stride(Compiler *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  TypedID<(spirv_cross::Types)1> *other;
  Meta *pMVar2;
  CompilerError *pCVar3;
  Decoration *dec;
  Meta *local_28;
  Meta *type_meta;
  SPIRType *pSStack_18;
  uint32_t index_local;
  SPIRType *type_local;
  Compiler *this_local;
  
  type_meta._4_4_ = index;
  pSStack_18 = type;
  type_local = (SPIRType *)this;
  other = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                    (&(type->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,(ulong)index);
  TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>
            ((TypedID<(spirv_cross::Types)0> *)((long)&dec + 4),other);
  pMVar2 = ParsedIR::find_meta(&this->ir,dec._4_4_);
  local_28 = pMVar2;
  if (pMVar2 == (Meta *)0x0) {
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar3,"Struct member does not have ArrayStride set.");
    __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  bVar1 = Bitset::get(&(pMVar2->decoration).decoration_flags,6);
  if (!bVar1) {
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar3,"Struct member does not have ArrayStride set.");
    __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  return (pMVar2->decoration).array_stride;
}

Assistant:

uint32_t Compiler::type_struct_member_array_stride(const SPIRType &type, uint32_t index) const
{
	auto *type_meta = ir.find_meta(type.member_types[index]);
	if (type_meta)
	{
		// Decoration must be set in valid SPIR-V, otherwise throw.
		// ArrayStride is part of the array type not OpMemberDecorate.
		auto &dec = type_meta->decoration;
		if (dec.decoration_flags.get(DecorationArrayStride))
			return dec.array_stride;
		else
			SPIRV_CROSS_THROW("Struct member does not have ArrayStride set.");
	}
	else
		SPIRV_CROSS_THROW("Struct member does not have ArrayStride set.");
}